

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gausslobatto.hpp
# Opt level: O1

tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
IntegratorXX::quadrature_traits<IntegratorXX::GaussLobatto<double,_double>,_void>::generate
          (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,size_t npts)

{
  _Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
  *p_Var1;
  runtime_error *this;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  weight_container weights;
  point_container points;
  allocator_type local_91;
  double local_90;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_70;
  _Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
  *local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  local_58 = (_Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
              *)__return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector(&local_70,npts,(allocator_type *)&local_88);
  std::vector<double,_std::allocator<double>_>::vector(&local_88,npts,&local_91);
  auVar8._8_4_ = (int)(npts >> 0x20);
  auVar8._0_8_ = npts;
  auVar8._12_4_ = 0x45300000;
  dVar9 = auVar8._8_8_ - 1.9342813113834067e+25;
  dVar14 = dVar9 + ((double)CONCAT44(0x43300000,(int)npts) - 4503599627370496.0);
  local_50 = dVar14 + -1.0;
  local_90 = 2.0 / (local_50 * dVar14);
  if (3 < npts + 1) {
    sVar6 = 2;
    if (2 < npts) {
      sVar6 = npts;
    }
    uVar5 = 1;
    local_48 = dVar14;
    dStack_40 = dVar9;
    do {
      lVar4 = (npts - 1) - uVar5;
      auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar10._0_8_ = lVar4;
      auVar10._12_4_ = 0x45300000;
      dVar9 = cos((((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) *
                  3.141592653589793) / local_50);
      uVar2 = 0;
      bVar7 = true;
      do {
        if (npts - 1 == 0) {
          dVar12 = 0.0;
          dVar14 = 1.0;
        }
        else {
          sVar3 = 1;
          dVar13 = 0.0;
          dVar14 = 1.0;
          do {
            dVar12 = dVar14;
            auVar11._8_4_ = (int)(sVar3 >> 0x20);
            auVar11._0_8_ = sVar3;
            auVar11._12_4_ = 0x45300000;
            dVar14 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
            dVar14 = ((dVar14 + dVar14 + -1.0) * dVar9 * dVar12 - (dVar14 + -1.0) * dVar13) / dVar14
            ;
            sVar3 = sVar3 + 1;
            dVar13 = dVar12;
          } while (sVar6 != sVar3);
        }
        dVar12 = dVar9 - (dVar9 * dVar14 - dVar12) / (dVar14 * local_48);
        if (ABS(dVar12 - dVar9) <= 2.220446049250313e-16) break;
        bVar7 = uVar2 < 99;
        uVar2 = uVar2 + 1;
        dVar9 = dVar12;
      } while (uVar2 != 100);
      if (!bVar7) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Gauss-Lobatto Newton Iterations Failed to Converge")
        ;
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      dVar9 = local_90 / (dVar14 * dVar14);
      local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar5] = dVar12;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar5] = dVar9;
      local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4] = -dVar12;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4] = dVar9;
      uVar5 = uVar5 + 1;
    } while (uVar5 != npts + 1 >> 1);
  }
  p_Var1 = local_58;
  *local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = -1.0;
  *local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = local_90;
  local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[npts - 1] = 1.0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[npts - 1] = local_90;
  if ((npts & 1) != 0) {
    *(undefined8 *)
     ((long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + (npts & 0xfffffffffffffffe) * 4) = 0;
  }
  std::
  _Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,void>
            (local_58,&local_70,&local_88);
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
          *)p_Var1;
}

Assistant:

inline static std::tuple<point_container, weight_container> generate(
      size_t npts) {
    point_container points(npts);
    weight_container weights(npts);

    // Absolute precision for the nodes
    const auto eps = std::numeric_limits<double>::epsilon();

    // 2/(n(n-1)) appears in many expressions
    weight_type two_ov_nnm1 = 2.0 / (npts * (npts - 1.0));

    // Since the rules are symmetric around the origin, we only need
    // to compute one half of the points
    const size_t mid = (npts+1) / 2;
    for(size_t idx = 1; idx < mid; ++idx) {
      // Initial guess
      const point_type i = npts - 1 - idx;
      point_type z = cos (i * M_PI / ( npts - 1.0));

      // Old value of root
      point_type z_old = -2.0;
      // Values of P_{n-1}(x), dP_{n-1}/dx, P_{n-2}(x)
      point_type p_nm1, p_nm2;

      // Solve the root to eps absolute precision
      bool converged = false;
      const int maxit = 100;
      for(int it = 0; it < maxit; ++it) {
        // Evaluate the Legendre polynomial at z and its derivative
        std::tie(p_nm1, std::ignore, p_nm2) = IntegratorXX::eval_Pn(z, npts - 1);

        // Newton update for the root. This equation might look
        // peculiar, but it is correct: you can derive it by using
        // Newton's method to search for the roots of f(x) = (x^2-1)
        // P_{n}'(x), and using the differential equation satisfied by
        // the Legendre polynomials to find that f'(x) = n(n+1)
        // P_{n}(x).
        z_old = z;
        z -= (z*p_nm1 - p_nm2) / (npts*p_nm1);
        // Convergence check
        if(std::abs(z - z_old) <= eps) {
          converged = true;
          break;
        }
      }  // end while

      if(not converged) {
        throw std::runtime_error(
            "Gauss-Lobatto Newton Iterations Failed to Converge");
      }

      // Quadrature node is z
      point_type pt = z;
      // Quadrature weight is 2 / [n (n-1) (1-x^2) P_{n-1}(x)^2]
      weight_type wgt = two_ov_nnm1 / (p_nm1 * p_nm1);

      // Store the symmetric points
      points[idx] = pt;
      weights[idx] = wgt;

      points[npts - 1 - idx] = -pt;
      weights[npts - 1 - idx] = wgt;
    }  // Loop over points

    // Nodes and weights of the end points
    points[0] = -1.0;
    weights[0] = two_ov_nnm1;
    points[npts - 1] = 1.0;
    weights[npts - 1] = two_ov_nnm1;

    if(npts%2==1) {
      // Rule with even number of points has a node at the origin
      points[npts/2]=0.0;
    }

    return std::make_tuple(points, weights);
  }